

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O3

void InverseTransformPoint3x3(btVector3 *out,btVector3 *in,btTransform *tr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  
  fVar1 = in->m_floats[0];
  fVar2 = in->m_floats[1];
  fVar3 = in->m_floats[2];
  fVar4 = (tr->m_basis).m_el[1].m_floats[2];
  fVar5 = (tr->m_basis).m_el[0].m_floats[2];
  fVar6 = (tr->m_basis).m_el[2].m_floats[2];
  uVar7 = *(undefined8 *)(tr->m_basis).m_el[0].m_floats;
  uVar8 = *(undefined8 *)(tr->m_basis).m_el[1].m_floats;
  uVar9 = *(undefined8 *)(tr->m_basis).m_el[2].m_floats;
  *(ulong *)out->m_floats =
       CONCAT44(fVar3 * (float)((ulong)uVar9 >> 0x20) +
                fVar1 * (float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar8 >> 0x20) * fVar2,
                fVar3 * (float)uVar9 + fVar1 * (float)uVar7 + (float)uVar8 * fVar2);
  out->m_floats[2] = fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2;
  out->m_floats[3] = 0.0;
  return;
}

Assistant:

void InverseTransformPoint3x3(btVector3& out, const btVector3& in, const btTransform& tr)
{
	const btMatrix3x3& rot = tr.getBasis();
	const btVector3& r0 = rot[0];
	const btVector3& r1 = rot[1];
	const btVector3& r2 = rot[2];

	const btScalar x = r0.x()*in.x() + r1.x()*in.y() + r2.x()*in.z();
	const btScalar y = r0.y()*in.x() + r1.y()*in.y() + r2.y()*in.z();
	const btScalar z = r0.z()*in.x() + r1.z()*in.y() + r2.z()*in.z();

	out.setValue(x, y, z);
}